

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_ctor_copy_convertible(void)

{
  bool bVar1;
  undefined4 local_a4;
  size_type local_a0;
  undefined4 local_94;
  size_type local_90 [2];
  undefined1 local_80 [8];
  circular_view<const_int,_18446744073709551615UL> clone;
  size_type local_58;
  undefined4 local_4c;
  size_type local_48 [2];
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::empty
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x33,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",bVar1);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::full
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x34,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",!bVar1);
  local_48[0] = vista::circular_view<int,_18446744073709551615UL>::size
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x35,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",local_48,&local_4c);
  local_58 = vista::circular_view<int,_18446744073709551615UL>::capacity
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  clone.member.next._4_4_ = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x36,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",&local_58,
             (undefined1 *)((long)&clone.member.next + 4));
  vista::circular_view<const_int,_18446744073709551615UL>::
  circular_view<int,_18446744073709551615UL,_0>
            ((circular_view<const_int,_18446744073709551615UL> *)local_80,
             (circular_view<int,_18446744073709551615UL> *)local_38);
  bVar1 = vista::circular_view<const_int,_18446744073709551615UL>::empty
                    ((circular_view<const_int,_18446744073709551615UL> *)local_80);
  boost::detail::test_impl
            ("clone.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x38,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",bVar1);
  bVar1 = vista::circular_view<const_int,_18446744073709551615UL>::full
                    ((circular_view<const_int,_18446744073709551615UL> *)local_80);
  boost::detail::test_impl
            ("!clone.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x39,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",(bool)(bVar1 - 1U & 1))
  ;
  local_90[0] = vista::circular_view<const_int,_18446744073709551615UL>::size
                          ((circular_view<const_int,_18446744073709551615UL> *)local_80);
  local_94 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x3a,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",local_90,&local_94);
  local_a0 = vista::circular_view<const_int,_18446744073709551615UL>::capacity
                       ((circular_view<const_int,_18446744073709551615UL> *)local_80);
  local_a4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("clone.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x3b,"void api_dynamic_suite::dynamic_ctor_copy_convertible()",&local_a0,&local_a4);
  return;
}

Assistant:

void dynamic_ctor_copy_convertible()
{
    int array[4] = {};
    circular_view<int> span(array);
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
    circular_view<const int> clone(span);
    BOOST_TEST(clone.empty());
    BOOST_TEST(!clone.full());
    BOOST_TEST_EQ(clone.size(), 0);
    BOOST_TEST_EQ(clone.capacity(), 4);
}